

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_string.hpp
# Opt level: O0

string * __thiscall
iutest::detail::ToHexString<unsigned__int128>
          (string *__return_storage_ptr__,detail *this,unsigned___int128 value)

{
  byte bVar1;
  char cVar2;
  uint n;
  byte bVar3;
  uint uVar4;
  ulong in_RDX;
  allocator<char> local_71;
  ulong local_70;
  size_t i;
  char buf [33];
  size_t kN;
  unsigned___int128 value_local;
  
  stack0xffffffffffffffc0 = 0x20;
  memset(&i,0,0x21);
  for (local_70 = 0; local_70 < 0x20; local_70 = local_70 + 1) {
    uVar4 = (0x1f - (int)local_70) * 4;
    bVar3 = (byte)uVar4;
    bVar1 = bVar3 & 0x3f;
    n = (uint)((ulong)this >> bVar1) | (uint)(in_RDX << 0x40 - bVar1);
    if ((uVar4 & 0x40) != 0) {
      n = (uint)(in_RDX >> (bVar3 & 0x3f));
    }
    cVar2 = ToHex(n);
    buf[local_70 - 8] = cVar2;
  }
  buf[0x18] = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)&i,&local_71);
  std::allocator<char>::~allocator(&local_71);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string ToHexString(T value)
{
    const size_t kN = sizeof(T)*2;
    char buf[kN + 1] = {0};
    for( size_t i=0; i < kN; ++i )
    {
        buf[i] = ToHex(static_cast<unsigned int>((value>>((kN-i-1)*4))));
    }
    buf[kN] = '\0';
    return buf;
}